

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  Message *in_stack_000000b0;
  Descriptor *in_stack_000000b8;
  GeneratedMessageFactory *in_stack_000000c0;
  
  anon_unknown_0::GeneratedMessageFactory::singleton();
  anon_unknown_0::GeneratedMessageFactory::RegisterType
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}